

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kliveness.c
# Opt level: O0

int Abc_CommandCS_kLiveness(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  abctime aVar2;
  abctime aVar3;
  Aig_Man_t *local_a0;
  Aig_Man_t *pWorkingAig;
  Vec_Ptr_t *vMasterBarrierDisjuncts;
  double time_spent;
  abctime endTime;
  abctime beginTime;
  int safetyInvariantPO;
  int c;
  int directive;
  int fVerbose;
  int liveIndex_k;
  int liveIndex_0;
  int RetValue;
  int absorberLimit;
  int absorberCount;
  Aig_Man_t *pAigCSNew;
  Aig_Man_t *pAigCS;
  Aig_Man_t *pAig;
  Abc_Ntk_t *pNtkTemp;
  Abc_Ntk_t *pNtk;
  char **argv_local;
  Abc_Frame_t *pAStack_18;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  liveIndex_0 = 500;
  fVerbose = -1;
  directive = -1;
  safetyInvariantPO = -1;
  beginTime._4_4_ = -1;
  pWorkingAig = (Aig_Man_t *)0x0;
  pNtk = (Abc_Ntk_t *)argv;
  argv_local._4_4_ = argc;
  pAStack_18 = pAbc;
  pNtkTemp = Abc_FrameReadNtk(pAbc);
  if (argv_local._4_4_ != 1) {
    Extra_UtilGetoptReset();
LAB_00737555:
    iVar1 = Extra_UtilGetopt(argv_local._4_4_,(char **)pNtk,"cmCgh");
    if (iVar1 != -1) {
      switch(iVar1) {
      case 0x43:
        safetyInvariantPO = 3;
        goto LAB_00737555;
      default:
        break;
      case 99:
        safetyInvariantPO = 1;
        goto LAB_00737555;
      case 0x67:
        safetyInvariantPO = 4;
        goto LAB_00737555;
      case 0x68:
        break;
      case 0x6d:
        goto switchD_00737599_caseD_6d;
      }
      fprintf(_stdout,"usage: kcs [-cmgCh]\n");
      fprintf(_stdout,"\timplements Claessen-Sorensson\'s k-Liveness algorithm\n");
      fprintf(_stdout,
              "\t-c : verification with constraints, looks for POs prefixed with csSafetyInvar_\n");
      fprintf(_stdout,"\t-m : discovers monotone signals\n");
      fprintf(_stdout,
              "\t-g : verification with user-supplied barriers, looks for POs prefixed with csLevel1Stabil_\n"
             );
      fprintf(_stdout,"\t-C : verification with discovered monotone signals\n");
      fprintf(_stdout,"\t-h : print usage\n");
      return 1;
    }
    goto LAB_007375cd;
  }
  safetyInvariantPO = 0;
LAB_007375cd:
  iVar1 = Abc_NtkIsStrash(pNtkTemp);
  if (iVar1 == 0) {
    printf("The input network was not strashed, strashing....\n");
    pAig = (Aig_Man_t *)Abc_NtkStrash(pNtkTemp,0,0,0);
    pAigCS = Abc_NtkToDar((Abc_Ntk_t *)pAig,0,1);
  }
  else {
    pAigCS = Abc_NtkToDar(pNtkTemp,0,1);
    pAig = (Aig_Man_t *)pNtkTemp;
  }
  if ((safetyInvariantPO == 1) &&
     (beginTime._4_4_ = collectSafetyInvariantPOIndex((Abc_Ntk_t *)pAig), beginTime._4_4_ == -1)) {
    __assert_fail("safetyInvariantPO != -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/live/kliveness.c"
                  ,0x25c,"int Abc_CommandCS_kLiveness(Abc_Frame_t *, int, char **)");
  }
  if (safetyInvariantPO == 2) {
    aVar2 = Abc_Clock();
    findDisjunctiveMonotoneSignals(pNtkTemp);
    aVar3 = Abc_Clock();
    printf("pre-processing time = %f\n",(double)(aVar3 - aVar2) / 1000000.0);
  }
  else {
    if (safetyInvariantPO == 3) {
      beginTime._4_4_ = collectSafetyInvariantPOIndex((Abc_Ntk_t *)pAig);
      if (beginTime._4_4_ == -1) {
        __assert_fail("safetyInvariantPO != -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/live/kliveness.c"
                      ,0x26c,"int Abc_CommandCS_kLiveness(Abc_Frame_t *, int, char **)");
      }
      aVar2 = Abc_Clock();
      pWorkingAig = (Aig_Man_t *)findDisjunctiveMonotoneSignals(pNtkTemp);
      aVar3 = Abc_Clock();
      printf("pre-processing time = %f\n",(double)(aVar3 - aVar2) / 1000000.0);
      if (pWorkingAig == (Aig_Man_t *)0x0) {
        __assert_fail("vMasterBarrierDisjuncts != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/live/kliveness.c"
                      ,0x274,"int Abc_CommandCS_kLiveness(Abc_Frame_t *, int, char **)");
      }
      iVar1 = Vec_PtrSize((Vec_Ptr_t *)pWorkingAig);
      if (iVar1 < 1) {
        __assert_fail("Vec_PtrSize(vMasterBarrierDisjuncts) > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/live/kliveness.c"
                      ,0x275,"int Abc_CommandCS_kLiveness(Abc_Frame_t *, int, char **)");
      }
    }
    if (safetyInvariantPO == 4) {
      beginTime._4_4_ = collectSafetyInvariantPOIndex((Abc_Ntk_t *)pAig);
      if (beginTime._4_4_ == -1) {
        __assert_fail("safetyInvariantPO != -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/live/kliveness.c"
                      ,0x27b,"int Abc_CommandCS_kLiveness(Abc_Frame_t *, int, char **)");
      }
      aVar2 = Abc_Clock();
      pWorkingAig = (Aig_Man_t *)collectUserGivenDisjunctiveMonotoneSignals(pNtkTemp);
      aVar3 = Abc_Clock();
      printf("pre-processing time = %f\n",(double)(aVar3 - aVar2) / 1000000.0);
      if (pWorkingAig == (Aig_Man_t *)0x0) {
        __assert_fail("vMasterBarrierDisjuncts != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/live/kliveness.c"
                      ,0x283,"int Abc_CommandCS_kLiveness(Abc_Frame_t *, int, char **)");
      }
      iVar1 = Vec_PtrSize((Vec_Ptr_t *)pWorkingAig);
      if (iVar1 < 1) {
        __assert_fail("Vec_PtrSize(vMasterBarrierDisjuncts) > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/live/kliveness.c"
                      ,0x284,"int Abc_CommandCS_kLiveness(Abc_Frame_t *, int, char **)");
      }
    }
    if ((safetyInvariantPO == 3) || (safetyInvariantPO == 4)) {
      if (pWorkingAig == (Aig_Man_t *)0x0) {
        __assert_fail("vMasterBarrierDisjuncts != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/live/kliveness.c"
                      ,0x289,"int Abc_CommandCS_kLiveness(Abc_Frame_t *, int, char **)");
      }
      local_a0 = generateWorkingAigWithDSC(pAigCS,pNtkTemp,&fVerbose,(Vec_Ptr_t *)pWorkingAig);
      pAigCSNew = introduceAbsorberLogic(local_a0,&fVerbose,&directive,0);
    }
    else {
      local_a0 = generateWorkingAig(pAigCS,pNtkTemp,&fVerbose);
      pAigCSNew = introduceAbsorberLogic(local_a0,&fVerbose,&directive,0);
    }
    Aig_ManStop(local_a0);
    for (RetValue = 1; RetValue < liveIndex_0; RetValue = RetValue + 1) {
      liveIndex_k = flipConePdr(pAigCSNew,safetyInvariantPO,directive,beginTime._4_4_,RetValue);
      if (liveIndex_k == 1) {
        Abc_Print(1,"k = %d, Property proved\n",(ulong)(uint)RetValue);
        break;
      }
      if (liveIndex_k == 0) {
        Abc_Print(1,"k = %d, Property DISPROVED\n",(ulong)(uint)RetValue);
      }
      else {
        if (liveIndex_k != -1) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/live/kliveness.c"
                        ,0x2ab,"int Abc_CommandCS_kLiveness(Abc_Frame_t *, int, char **)");
        }
        Abc_Print(1,"Property UNDECIDED with k = %d.\n",(ulong)(uint)RetValue);
      }
      _absorberLimit = introduceAbsorberLogic(pAigCSNew,&fVerbose,&directive,RetValue);
      Aig_ManStop(pAigCSNew);
      pAigCSNew = _absorberLimit;
    }
    Aig_ManStop(pAigCSNew);
    Aig_ManStop(pAigCS);
    if (safetyInvariantPO == 4) {
      deallocateMasterBarrierDisjunctInt((Vec_Ptr_t *)pWorkingAig);
    }
    else {
      deallocateMasterBarrierDisjunctInt((Vec_Ptr_t *)pWorkingAig);
    }
  }
  return 0;
switchD_00737599_caseD_6d:
  safetyInvariantPO = 2;
  goto LAB_00737555;
}

Assistant:

int Abc_CommandCS_kLiveness( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    	Abc_Ntk_t * pNtk, * pNtkTemp;
	Aig_Man_t * pAig, *pAigCS, *pAigCSNew;
	int absorberCount;
	int absorberLimit = 500;
	int RetValue;
	int liveIndex_0 = -1, liveIndex_k = -1;
	int fVerbose = 1;
	int directive = -1;
	int c;
	int safetyInvariantPO = -1;
	abctime beginTime, endTime;
	double time_spent;
	Vec_Ptr_t *vMasterBarrierDisjuncts = NULL;
	Aig_Man_t *pWorkingAig;
	//FILE *fp;

	pNtk = Abc_FrameReadNtk(pAbc);

	//fp = fopen("propFile.txt", "r");
	//if( fp )
	//	getVecOfVecFairness(fp);
	//exit(0);

	/*************************************************
	Extraction of Command Line Argument	
	*************************************************/
	if( argc == 1 )
	{
		assert( directive == -1 );
		directive = SIMPLE_kCS;
	}
	else
	{
		Extra_UtilGetoptReset();
		while ( ( c = Extra_UtilGetopt( argc, argv, "cmCgh" ) ) != EOF )
		{
			switch( c )
			{
			case 'c':
				directive = kCS_WITH_SAFETY_INVARIANTS; 
				break;
			case 'm':
				directive = kCS_WITH_DISCOVER_MONOTONE_SIGNALS; 
				break;
			case 'C':
				directive = kCS_WITH_SAFETY_AND_DCS_INVARIANTS;
				break;
			case 'g':
				directive = kCS_WITH_SAFETY_AND_USER_GIVEN_DCS_INVARIANTS;
				break;
			case 'h':
				goto usage;
				break;
			default:
				goto usage;
			}
		}
	}
	/*************************************************
	Extraction of Command Line Argument Ends	
	*************************************************/

	if( !Abc_NtkIsStrash( pNtk ) )
	{
		printf("The input network was not strashed, strashing....\n");
		pNtkTemp = Abc_NtkStrash( pNtk, 0, 0, 0 );
		pAig = Abc_NtkToDar( pNtkTemp, 0, 1 );
	}
	else
	{
		pAig = Abc_NtkToDar( pNtk, 0, 1 );
		pNtkTemp = pNtk;
	}

	if( directive == kCS_WITH_SAFETY_INVARIANTS )
	{
		safetyInvariantPO = collectSafetyInvariantPOIndex(pNtkTemp);			
		assert( safetyInvariantPO != -1 );
	}

	if(directive == kCS_WITH_DISCOVER_MONOTONE_SIGNALS)
	{
		beginTime = Abc_Clock();
		vMasterBarrierDisjuncts = findDisjunctiveMonotoneSignals( pNtk );
		endTime = Abc_Clock();
		time_spent = (double)(endTime - beginTime)/CLOCKS_PER_SEC;
		printf("pre-processing time = %f\n",time_spent); 
		return 0;
	}

	if(directive == kCS_WITH_SAFETY_AND_DCS_INVARIANTS)
	{
		safetyInvariantPO = collectSafetyInvariantPOIndex(pNtkTemp);			
		assert( safetyInvariantPO != -1 );

		beginTime = Abc_Clock();
		vMasterBarrierDisjuncts = findDisjunctiveMonotoneSignals( pNtk );
		endTime = Abc_Clock();
		time_spent = (double)(endTime - beginTime)/CLOCKS_PER_SEC;
		printf("pre-processing time = %f\n",time_spent); 

		assert( vMasterBarrierDisjuncts != NULL );
		assert( Vec_PtrSize(vMasterBarrierDisjuncts) > 0 );
	}

	if(directive == kCS_WITH_SAFETY_AND_USER_GIVEN_DCS_INVARIANTS)
	{
		safetyInvariantPO = collectSafetyInvariantPOIndex(pNtkTemp);			
		assert( safetyInvariantPO != -1 );

		beginTime = Abc_Clock();
		vMasterBarrierDisjuncts = collectUserGivenDisjunctiveMonotoneSignals( pNtk );
		endTime = Abc_Clock();
		time_spent = (double)(endTime - beginTime)/CLOCKS_PER_SEC;
		printf("pre-processing time = %f\n",time_spent); 

		assert( vMasterBarrierDisjuncts != NULL );
		assert( Vec_PtrSize(vMasterBarrierDisjuncts) > 0 );
	}

	if(directive == kCS_WITH_SAFETY_AND_DCS_INVARIANTS || directive == kCS_WITH_SAFETY_AND_USER_GIVEN_DCS_INVARIANTS)
	{
		assert( vMasterBarrierDisjuncts != NULL );
		pWorkingAig = generateWorkingAigWithDSC( pAig, pNtk, &liveIndex_0, vMasterBarrierDisjuncts );
		pAigCS = introduceAbsorberLogic(pWorkingAig, &liveIndex_0, &liveIndex_k, 0);
	}
	else
	{
		pWorkingAig = generateWorkingAig( pAig, pNtk, &liveIndex_0 );
		pAigCS = introduceAbsorberLogic(pWorkingAig, &liveIndex_0, &liveIndex_k, 0);
	}

	Aig_ManStop(pWorkingAig);

	for( absorberCount=1; absorberCount<absorberLimit; absorberCount++ )
	{
		//printf( "\nindex of the liveness output = %d\n", liveIndex_k );
		RetValue = flipConePdr( pAigCS, directive, liveIndex_k, safetyInvariantPO, absorberCount );

		if ( RetValue == 1 )
		{
        		Abc_Print( 1, "k = %d, Property proved\n", absorberCount );
			break;
		}
    		else if ( RetValue == 0 )
		{
			if( fVerbose )
			{
				Abc_Print( 1, "k = %d, Property DISPROVED\n", absorberCount );
			}
		}
    		else if ( RetValue == -1 )
		{
        		Abc_Print( 1, "Property UNDECIDED with k = %d.\n", absorberCount );
		}
    		else
        		assert( 0 );

		pAigCSNew = introduceAbsorberLogic(pAigCS, &liveIndex_0, &liveIndex_k, absorberCount);
		Aig_ManStop(pAigCS);
		pAigCS = pAigCSNew;
	}

	Aig_ManStop(pAigCS);
	Aig_ManStop(pAig);

	if(directive == kCS_WITH_SAFETY_AND_USER_GIVEN_DCS_INVARIANTS)
	{
		deallocateMasterBarrierDisjunctInt(vMasterBarrierDisjuncts);
	}
	else
	{
		//if(vMasterBarrierDisjuncts)
		//	Vec_PtrFree(vMasterBarrierDisjuncts);
		//deallocateMasterBarrierDisjunctVecPtrVecInt(vMasterBarrierDisjuncts);
		deallocateMasterBarrierDisjunctInt(vMasterBarrierDisjuncts);
	}
	return 0;

	usage:
		fprintf( stdout, "usage: kcs [-cmgCh]\n" );
    		fprintf( stdout, "\timplements Claessen-Sorensson's k-Liveness algorithm\n" );
		fprintf( stdout, "\t-c : verification with constraints, looks for POs prefixed with csSafetyInvar_\n");
		fprintf( stdout, "\t-m : discovers monotone signals\n");
    		fprintf( stdout, "\t-g : verification with user-supplied barriers, looks for POs prefixed with csLevel1Stabil_\n");
		fprintf( stdout, "\t-C : verification with discovered monotone signals\n");
		fprintf( stdout, "\t-h : print usage\n");
    		return 1;

}